

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpreini.cpp
# Opt level: O3

void vm_run_preinit(CVmFile *origfp,char *image_fname,CVmFile *newfp,CVmHostIfc *hostifc,
                   CVmMainClientIfc *clientifc,char **argv,int argc,
                   CVmRuntimeSymbols *runtime_symtab,CVmRuntimeSymbols *runtime_macros)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  long *in_FS_OFFSET;
  CVmImageLoader *loader;
  vm_globals *vmg__;
  err_frame_t err_cur__;
  CVmImageLoader *local_158;
  CVmImageFile *local_150;
  vm_globals *local_138;
  uint local_130 [2];
  long local_128;
  int *local_120;
  __jmp_buf_tag local_118;
  vm_init_options local_50;
  
  local_158 = (CVmImageLoader *)0x0;
  local_150 = (CVmImageFile *)0x0;
  local_50.charset = (char *)0x0;
  local_50.log_charset = (char *)0x0;
  local_50.hostifc = hostifc;
  local_50.clientifc = clientifc;
  vm_initialize(&local_138,&local_50);
  (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[4])(G_console_X,0);
  G_err_frame::__tls_init();
  local_128 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_130;
  local_130[0] = _setjmp(&local_118);
  if (local_130[0] == 0) {
    lVar3 = ftell((FILE *)origfp->fp_);
    lVar1 = origfp->seek_base_;
    local_150 = (CVmImageFile *)operator_new(0x20);
    local_150->_vptr_CVmImageFile = (_func_int **)&PTR__CVmImageFileExt_003233e8;
    local_150[1]._vptr_CVmImageFile = (_func_int **)origfp;
    local_150[2]._vptr_CVmImageFile = (_func_int **)0x0;
    local_150[3]._vptr_CVmImageFile = (_func_int **)0x0;
    local_158 = (CVmImageLoader *)operator_new(0x98);
    CVmImageLoader::CVmImageLoader(local_158,local_150,image_fname,0);
    CVmImageLoader::load(local_158);
    G_preinit_mode_X = 1;
    CVmImageLoader::run(local_158,argv,argc,runtime_symtab,runtime_macros,(char *)0x0);
    fseek((FILE *)origfp->fp_,(lVar3 - lVar1) + origfp->seek_base_,0);
    vm_rewrite_image(origfp,newfp,local_158->static_cs_ofs_);
  }
  if (local_130[0] == 1) {
    local_130[0] = 2;
    if (*local_120 == 0x8fe) {
      err_throw(0x2973);
    }
    err_rethrow();
  }
  if (-1 < (short)local_130[0]) {
    local_130[0] = local_130[0] | 0x8000;
    if (local_158 != (CVmImageLoader *)0x0) {
      CVmImageLoader::unload(local_158);
      if (local_158 != (CVmImageLoader *)0x0) {
        CVmImageLoader::~CVmImageLoader(local_158);
      }
      operator_delete(local_158,0x98);
    }
    if ((local_150 != (CVmImageFile *)0x0) && (local_150 != (CVmImageFile *)0x0)) {
      (*local_150->_vptr_CVmImageFile[1])();
    }
    vm_terminate(local_138,clientifc);
  }
  lVar1 = local_128;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_130[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    piVar2 = local_120;
    G_err_frame::__tls_init();
    *(int **)(*in_FS_OFFSET + 0x10) = piVar2;
    err_rethrow();
  }
  if ((local_130[0] & 2) != 0) {
    free(local_120);
  }
  return;
}

Assistant:

void vm_run_preinit(CVmFile *origfp, const char *image_fname,
                    CVmFile *newfp, class CVmHostIfc *hostifc,
                    class CVmMainClientIfc *clientifc, 
                    const char *const *argv, int argc,
                    class CVmRuntimeSymbols *runtime_symtab,
                    class CVmRuntimeSymbols *runtime_macros)
{
    vm_globals *vmg__;
    CVmImageLoader *volatile loader = 0;
    CVmImageFile *volatile imagefp = 0;

    /* initialize the VM */
    vm_init_options opts(hostifc, clientifc);
    vm_initialize(&vmg__, &opts);

    /* 
     *   turn off "more" on the console - when running preinitialization,
     *   any output is purely diagnostic information for the programmer
     *   and thus should be formatted as simple stdio-style console output 
     */
    G_console->set_more_state(FALSE);

    err_try
    {
        /* note where the image file starts */
        long start_pos = origfp->get_pos();
        
        /* create the loader */
        imagefp = new CVmImageFileExt(origfp);
        loader = new CVmImageLoader(imagefp, image_fname, 0);

        /* load the image */
        loader->load(vmg0_);

        /* set pre-init mode */
        G_preinit_mode = TRUE;

        /* run it, using the runtime symbols the caller sent us */
        loader->run(vmg_ argv, argc, runtime_symtab, runtime_macros, 0);

        /* 
         *   seek back to the start of the image file, since we need to
         *   copy parts of the original file to the new file 
         */
        origfp->set_pos(start_pos);

        /* save the new image file */
        vm_rewrite_image(vmg_ origfp, newfp, loader->get_static_cs_ofs());
    }